

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,MemberSyntax *syntax,
          StatementSyntax *stmtSyntax,
          span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
          *additionalBlocks)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  size_type sVar2;
  ProceduralBlockSymbol *this;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar3;
  ProceduralBlockKind local_34;
  SourceLocation local_30;
  
  local_34 = kind;
  local_30 = location;
  this = BumpAllocator::
         emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&>
                   (&scope->compilation->super_BumpAllocator,&local_30,&local_34);
  (this->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  psVar1 = &(syntax->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ == 0 ||
      psVar1->data_ != (pointer)0x0) {
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
    sVar3 = Statement::createBlockItems(scope,stmtSyntax,false);
    this->blocks = sVar3;
    this->stmtSyntax = stmtSyntax;
    sVar2 = (this->blocks).size_;
    additionalBlocks->data_ = (this->blocks).data_;
    additionalBlocks->size_ = sVar2;
    return this;
  }
  std::terminate();
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    const Scope& scope, ProceduralBlockKind kind, SourceLocation location,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax,
    span<const StatementBlockSymbol* const>& additionalBlocks) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false);
    result->stmtSyntax = &stmtSyntax;

    additionalBlocks = result->blocks;

    return *result;
}